

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

String * __thiscall
sf::String::substring(String *__return_storage_ptr__,String *this,size_t position,size_t length)

{
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_> local_30
  ;
  
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::substr
            (&local_30,&this->m_string,position,length);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  basic_string(&__return_storage_ptr__->m_string,&local_30);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  ~basic_string(&local_30);
  return __return_storage_ptr__;
}

Assistant:

String String::substring(std::size_t position, std::size_t length) const
{
    return m_string.substr(position, length);
}